

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O3

void __thiscall BOWFileParser::writeWordList(BOWFileParser *this,string *wordListFilename)

{
  char cVar1;
  pointer pbVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ofstream wordListFp;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream((string *)&local_220);
  std::ofstream::open((string *)&local_220,(_Ios_Openmode)wordListFilename);
  pbVar2 = (this->_wordList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_wordList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_220,*(char **)((long)pbVar2 + lVar5 + -8),
                 *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
      pbVar2 = (this->_wordList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(this->_wordList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
      if (uVar4 != uVar3 - 1) {
        cVar1 = (char)(string *)&local_220;
        std::ios::widen((char)*(undefined8 *)(local_220 + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        pbVar2 = (this->_wordList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = (long)(this->_wordList).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < uVar3);
  }
  std::ofstream::close();
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void BOWFileParser::writeWordList(string wordListFilename)const{//{{{
    ofstream wordListFp;
    wordListFp.open(wordListFilename,ios::out);
    for(int v=0;v<_wordList.size();v++){
        wordListFp<<_wordList[v];
        if(v!=(_wordList.size()-1))wordListFp<<endl;
    }
    wordListFp.close();
}